

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall NominalTest_TestIterSubTypes_Test::TestBody(NominalTest_TestIterSubTypes_Test *this)

{
  undefined1 *puVar1;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> type;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var2;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> type_00;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var3;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *pcVar4;
  char *in_R9;
  initializer_list<wasm::HeapType> __l;
  undefined1 auStack_158 [8];
  SubTypes subTypes;
  undefined1 local_100 [8];
  TypeBuilder builder;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_e0;
  undefined4 local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_50;
  anon_class_8_1_6b5fb797 getSubTypes;
  AssertionResult gtest_ar_1;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)local_100,4);
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8 = (undefined1  [8])local_100;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_c8,(Struct *)auStack_158);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_158);
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_c8 = (undefined1  [8])local_100;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_c8,(Struct *)auStack_158);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_158);
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_c8 = (undefined1  [8])local_100;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_c8,(Struct *)auStack_158);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_158);
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_c8 = (undefined1  [8])local_100;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_c8,(Struct *)auStack_158);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_158);
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x1);
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x2);
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x3);
  wasm::TypeBuilder::build();
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_88[0] = (internal)
                ((char)subTypes.types.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage == '\0');
  if ((bool)local_88[0]) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_158);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_c8,__x);
    type._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           *)local_c8;
    _Var2._M_head_impl =
         (((TypeBuilder *)((long)local_c8 + 8))->impl)._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    type_00._M_head_impl =
         (((TypeBuilder *)((long)local_c8 + 0x10))->impl)._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    _Var3._M_head_impl =
         (((TypeBuilder *)((long)local_c8 + 0x18))->impl)._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_c8);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_158);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_100);
    __l._M_len = 4;
    __l._M_array = (iterator)local_c8;
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_Var2._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)type_00._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_Var3._M_head_impl;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88,__l,
               (allocator_type *)local_100);
    wasm::SubTypes::SubTypes
              ((SubTypes *)auStack_158,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88);
    local_50.data_ = (AssertHelperData *)auStack_158;
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,0);
    gtest_ar_1.success_ = false;
    gtest_ar_1._1_3_ = 0;
    getSubTypes.subTypes =
         (SubTypes *)
         type._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,&getSubTypes,&gtest_ar_1.message_,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 5));
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)local_100,"getSubTypes(A, 0)","TypeDepths({{A, 0}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_100[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)
          CONCAT44(builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) ==
          (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._4_4_,
                                    builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x469,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&builder);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_100 = (undefined1  [8])
                type._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_e0._M_head_impl = type_00._M_head_impl;
    local_d8 = 1;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,local_d0,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 5));
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&getSubTypes,"getSubTypes(A, 1)","TypeDepths({{A, 0}, {B, 1}, {C, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if ((char)getSubTypes.subTypes == '\0') {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_1);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_88,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,2);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var2._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_100,local_c8,local_88,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 5));
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&getSubTypes,"getSubTypes(A, 2)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    if ((char)getSubTypes.subTypes == '\0') {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_1);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_88,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,3);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
    puVar1 = (undefined1 *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 5);
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var2._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_100,local_c8,local_88,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),puVar1);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&getSubTypes,"getSubTypes(A, 3)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    if ((char)getSubTypes.subTypes == '\0') {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_1);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)type_00._M_head_impl,0);
    gtest_ar_1.success_ = false;
    gtest_ar_1._1_3_ = 0;
    getSubTypes.subTypes = (SubTypes *)type_00._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,&getSubTypes,&gtest_ar_1.message_,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),puVar1);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)local_100,"getSubTypes(C, 0)","TypeDepths({{C, 0}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_100[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)
          CONCAT44(builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) ==
          (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._4_4_,
                                    builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&builder);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)type_00._M_head_impl,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_100 = (undefined1  [8])type_00._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,&local_e0,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),puVar1);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&getSubTypes,"getSubTypes(C, 1)","TypeDepths({{C, 0}, {D, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if ((char)getSubTypes.subTypes == '\0') {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_1);
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)&local_50,
               (HeapType)type_00._M_head_impl,2);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_100 = (undefined1  [8])type_00._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,&local_e0,0,
               (undefined1 *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),(undefined1 *)
                    ((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),puVar1);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&getSubTypes,"getSubTypes(C, 2)","TypeDepths({{C, 0}, {D, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if ((char)getSubTypes.subTypes == '\0') {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x470,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_1);
    wasm::SubTypes::~SubTypes((SubTypes *)auStack_158);
  }
  else {
    testing::Message::Message((Message *)&getSubTypes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_88,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x454,(char *)local_c8);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&getSubTypes);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)local_c8);
    if (getSubTypes.subTypes != (SubTypes *)0x0) {
      (*(code *)((getSubTypes.subTypes)->types).
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_start[1].id)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_158);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_100);
  }
  return;
}

Assistant:

TEST_F(NominalTest, TestIterSubTypes) {
  /*
        A
       / \
      B   C
           \
            D
  */
  HeapType A, B, C, D;
  {
    TypeBuilder builder(4);
    builder[0] = Struct();
    builder[1] = Struct();
    builder[2] = Struct();
    builder[3] = Struct();
    builder.setSubType(1, builder.getTempHeapType(0));
    builder.setSubType(2, builder.getTempHeapType(0));
    builder.setSubType(3, builder.getTempHeapType(2));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
    D = built[3];
  }

  SubTypes subTypes({A, B, C, D});

  // Helper for comparing sets of types + their corresponding depth.
  using TypeDepths = std::unordered_set<std::pair<HeapType, Index>>;

  auto getSubTypes = [&](HeapType type, Index depth) {
    TypeDepths ret;
    subTypes.iterSubTypes(type, depth, [&](HeapType subType, Index depth) {
      ret.insert({subType, depth});
    });
    return ret;
  };

  EXPECT_EQ(getSubTypes(A, 0), TypeDepths({{A, 0}}));
  EXPECT_EQ(getSubTypes(A, 1), TypeDepths({{A, 0}, {B, 1}, {C, 1}}));
  EXPECT_EQ(getSubTypes(A, 2), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));
  EXPECT_EQ(getSubTypes(A, 3), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));

  EXPECT_EQ(getSubTypes(C, 0), TypeDepths({{C, 0}}));
  EXPECT_EQ(getSubTypes(C, 1), TypeDepths({{C, 0}, {D, 1}}));
  EXPECT_EQ(getSubTypes(C, 2), TypeDepths({{C, 0}, {D, 1}}));
}